

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O1

void __thiscall cfd::core::ScriptElement::ScriptElement(ScriptElement *this,ScriptOperator *op_code)

{
  ScriptType SVar1;
  pointer pcVar2;
  
  this->_vptr_ScriptElement = (_func_int **)&PTR__ScriptElement_0069ba50;
  this->type_ = kElementOpCode;
  (this->op_code_)._vptr_ScriptOperator = (_func_int **)&PTR__ScriptOperator_0069ba80;
  (this->op_code_).data_type_ = op_code->data_type_;
  (this->op_code_).text_data_._M_dataplus._M_p = (pointer)&(this->op_code_).text_data_.field_2;
  pcVar2 = (op_code->text_data_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->op_code_).text_data_,pcVar2,
             pcVar2 + (op_code->text_data_)._M_string_length);
  ByteData::ByteData(&this->binary_data_);
  this->value_ = 0;
  SVar1 = op_code->data_type_;
  if ((ulong)SVar1 == 0x4f || SVar1 - kOpTrue < 0x10) {
    this->value_ = (ulong)SVar1 - 0x50;
  }
  return;
}

Assistant:

ScriptElement::ScriptElement(const ScriptOperator& op_code)
    : type_(kElementOpCode), op_code_(op_code), binary_data_(), value_(0) {
  ScriptType type = op_code.GetDataType();
  if ((type == kOp1Negate) || ((type >= kOp_1) && (type <= kOp_16))) {
    // convert to numeric format
    int64_t base_value = static_cast<int64_t>(kOp_1) - 1;
    value_ = static_cast<int64_t>(type) - base_value;
  }
}